

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DrawSpecs.hpp
# Opt level: O2

void __thiscall sciplot::DrawSpecs::DrawSpecs(DrawSpecs *this,string *what,string *use,string *with)

{
  *(undefined ***)&this->super_LineSpecsOf<sciplot::DrawSpecs> = &PTR__Specs_001afc88;
  LineSpecsOf<sciplot::DrawSpecs>::LineSpecsOf
            (&this->super_LineSpecsOf<sciplot::DrawSpecs>,&PTR_PTR_001ac6a8);
  PointSpecsOf<sciplot::DrawSpecs>::PointSpecsOf
            (&this->super_PointSpecsOf<sciplot::DrawSpecs>,&PTR_construction_vtable_40__001ac6b8);
  FillSpecsOf<sciplot::DrawSpecs>::FillSpecsOf
            (&this->super_FillSpecsOf<sciplot::DrawSpecs>,&PTR_construction_vtable_40__001ac6c8);
  *(undefined ***)&this->super_LineSpecsOf<sciplot::DrawSpecs> = &PTR__DrawSpecs_001ac608;
  *(undefined ***)&this->super_PointSpecsOf<sciplot::DrawSpecs> = &PTR__DrawSpecs_001ac648;
  *(undefined ***)&this->super_FillSpecsOf<sciplot::DrawSpecs> = &PTR__DrawSpecs_001ac688;
  std::__cxx11::string::string((string *)&this->m_what,(string *)what);
  std::__cxx11::string::string((string *)&this->m_using,(string *)use);
  std::__cxx11::string::string((string *)&this->m_with,(string *)with);
  (this->m_title)._M_dataplus._M_p = (pointer)&(this->m_title).field_2;
  (this->m_title)._M_string_length = 0;
  (this->m_title).field_2._M_local_buf[0] = '\0';
  (this->m_xtic)._M_dataplus._M_p = (pointer)&(this->m_xtic).field_2;
  (this->m_xtic)._M_string_length = 0;
  (this->m_xtic).field_2._M_local_buf[0] = '\0';
  (this->m_ytic)._M_dataplus._M_p = (pointer)&(this->m_ytic).field_2;
  (this->m_ytic)._M_string_length = 0;
  (this->m_ytic).field_2._M_local_buf[0] = '\0';
  LineSpecsOf<sciplot::DrawSpecs>::lineWidth(&this->super_LineSpecsOf<sciplot::DrawSpecs>,2);
  return;
}

Assistant:

inline DrawSpecs::DrawSpecs(std::string what, std::string use, std::string with)
: m_what(what), m_using(use), m_with(with)
{
    lineWidth(internal::DEFAULT_LINEWIDTH);
}